

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgviz.hpp
# Opt level: O2

imgviz * __thiscall
imgviz::textInRectangle
          (imgviz *this,Mat *src,string *text,string *loc,int font_face,double font_scale,
          int thickness)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int baseline;
  Size text_size;
  _InputArray local_260;
  undefined4 local_248;
  int local_244;
  int local_240 [4];
  Mat extender;
  _OutputArray local_1d0;
  Matx<double,_4,_1> local_1b8;
  Matx<double,_4,_1> local_198 [11];
  
  iVar3 = font_face;
  bVar1 = std::operator==(loc,"lt+");
  if (!bVar1) {
    __assert_fail("loc == \"lt+\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/wkentaro[P]imgviz-cpp/include/imgviz.hpp"
                  ,200,
                  "cv::Mat imgviz::textInRectangle(const cv::Mat, const std::string, const std::string, const int, const double, const int)"
                 );
  }
  cv::Mat::clone();
  uVar2 = *(uint *)this;
  if ((uVar2 & 0xfff) == 0) {
    local_198[0].val[2] = 0.0;
    local_198[0].val[0] = (double)CONCAT44(local_198[0].val[0]._4_4_,0x1010000);
    _extender = 0x2010000;
    local_198[0].val[1] = (double)this;
    cv::cvtColor((cv *)local_198,(_InputArray *)&extender,(_OutputArray *)0x8,0,iVar3);
    uVar2 = *(uint *)this;
  }
  if ((uVar2 & 0xfff) == 0x10) {
    cv::getTextSize((string *)&text_size,(int)text,font_scale,font_face,
                    (int *)(ulong)(uint)thickness);
    iVar3 = baseline + thickness + text_size.height;
    cv::Mat::zeros((int)local_198,iVar3,*(int *)(src + 0xc));
    cv::MatExpr::operator_cast_to_Mat((MatExpr *)&extender);
    cv::MatExpr::~MatExpr((MatExpr *)local_198);
    local_198[0].val[1] = (double)&local_260;
    local_260.flags = 0;
    local_260._4_4_ = 0x406fe000;
    local_198[0].val[0]._0_4_ = -0x3efdfffa;
    local_198[0].val[2] = 2.12199579145934e-314;
    cv::noArray();
    cv::Mat::setTo((_InputArray *)&extender,(_InputArray *)local_198);
    local_198[0].val[2] = 0.0;
    local_198[0].val[0] = (double)CONCAT44(local_198[0].val[0]._4_4_,0x1010000);
    local_260.sz.width = 0;
    local_260.sz.height = 0;
    local_1d0.super__InputArray.sz.width = 0;
    local_1d0.super__InputArray.sz.height = 0;
    local_260.flags = 0x1010000;
    local_1d0.super__InputArray.flags = 0x2010000;
    local_260.obj = this;
    local_1d0.super__InputArray.obj = this;
    local_198[0].val[1] = (double)&extender;
    cv::vconcat((_InputArray *)local_198,&local_260,&local_1d0);
    local_260.sz.width = 0;
    local_260.sz.height = 0;
    local_240[2] = 0;
    local_260.flags = 0x3010000;
    local_240[0] = text_size.width;
    local_240[1] = 0;
    local_260.obj = this;
    local_240[3] = iVar3;
    cv::Matx<double,_4,_1>::Matx(local_198);
    local_198[0].val[0] = 255.0;
    local_198[0].val[1] = 255.0;
    local_198[0].val[2] = 255.0;
    local_198[0].val[3] = 0.0;
    cv::rectangle(&local_260,local_240 + 2,local_240,local_198,0xffffffffffffffff,8,0);
    local_198[0].val[2] = 0.0;
    local_244 = text_size.height + thickness * 2;
    local_198[0].val[0] = (double)CONCAT44(local_198[0].val[0]._4_4_,0x3010000);
    local_248 = 0;
    local_198[0].val[1] = (double)this;
    cv::Matx<double,_4,_1>::Matx(&local_1b8);
    local_1b8.val[2] = 0.0;
    local_1b8.val[3] = 0.0;
    local_1b8.val[0] = 0.0;
    local_1b8.val[1] = 0.0;
    cv::putText(SUB84(font_scale,0),local_198,text,&local_248,font_face,&local_1b8,
                (int *)(ulong)(uint)thickness,8,0);
    cv::Mat::~Mat(&extender);
    return this;
  }
  __assert_fail("dst.type() == CV_8UC3",
                "/workspace/llm4binary/github/license_c_cmakelists/wkentaro[P]imgviz-cpp/include/imgviz.hpp"
                ,0xce,
                "cv::Mat imgviz::textInRectangle(const cv::Mat, const std::string, const std::string, const int, const double, const int)"
               );
}

Assistant:

cv::Mat textInRectangle(const cv::Mat src, const std::string text,
                        const std::string loc = "lt+",
                        const int font_face = cv::FONT_HERSHEY_SIMPLEX,
                        const double font_scale = 1, const int thickness = 2) {
  assert(loc == "lt+"); // TODO(wkentaro): support other loc

  cv::Mat dst = src.clone();
  if (dst.type() == CV_8UC1) {
    cv::cvtColor(dst, dst, cv::COLOR_GRAY2BGR);
  }
  assert(dst.type() == CV_8UC3);

  int baseline;
  cv::Size text_size =
      cv::getTextSize(text, font_face, font_scale, thickness, &baseline);
  baseline += thickness;

  cv::Point text_org = cv::Point(0, text_size.height + thickness * 2);

  cv::Point aabb1 = text_org + cv::Point(0, baseline - thickness * 2);
  cv::Point aabb2 =
      text_org + cv::Point(text_size.width, -text_size.height - thickness * 2);

  cv::Mat extender = cv::Mat::zeros(aabb1.y - aabb2.y, src.cols, CV_8UC3);
  extender.setTo(255);
  cv::vconcat(extender, dst, dst);

  cv::rectangle(dst, aabb1, aabb2,
                /*color=*/cv::Scalar(255, 255, 255),
                /*thickness=*/cv::FILLED);
  cv::putText(dst, text, /*org=*/text_org,
              /*fontFace=*/font_face,
              /*fontScale=*/font_scale, /*color=*/cv::Scalar(0, 0, 0),
              /*thickness=*/thickness);

  return dst;
}